

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O1

void __thiscall HighsLpRelaxation::storeBasis(HighsLpRelaxation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  HighsBasis *pHVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  HighsBasis *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if ((this->currentbasisstored == false) && ((this->lpsolver).basis_.valid == true)) {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<HighsBasis,std::allocator<HighsBasis>,HighsBasis_const&>
              (a_Stack_20,&local_28,(allocator<HighsBasis> *)&local_29,&(this->lpsolver).basis_);
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    pHVar1 = local_28;
    local_28 = (HighsBasis *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->basischeckpoint).
              super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pHVar1;
    (this->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
    this->currentbasisstored = true;
  }
  return;
}

Assistant:

void storeBasis() {
    if (!currentbasisstored && lpsolver.getBasis().valid) {
      basischeckpoint = std::make_shared<HighsBasis>(lpsolver.getBasis());
      currentbasisstored = true;
    }
  }